

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.h
# Opt level: O1

RegisterLiveness * __thiscall
spvtools::opt::LivenessAnalysis::Get(LivenessAnalysis *this,Function *f)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  pair<std::__detail::_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false,_false>,_bool>
  *ppVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  Function *local_60;
  RegisterLiveness local_58;
  
  uVar1 = (this->analysis_cache_)._M_h._M_bucket_count;
  uVar4 = (ulong)f % uVar1;
  p_Var5 = (this->analysis_cache_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, (Function *)p_Var5->_M_nxt[1]._M_nxt != f)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (Function *)p_Var2[1]._M_nxt == f)) goto LAB_0024c215;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0024c215:
  if (p_Var6 == (__node_base_ptr)0x0) {
    ppVar3 = (pair<std::__detail::_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false,_false>,_bool>
              *)0x0;
  }
  else {
    ppVar3 = (pair<std::__detail::_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false,_false>,_bool>
              *)p_Var6->_M_nxt;
  }
  if (ppVar3 == (pair<std::__detail::_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false,_false>,_bool>
                 *)0x0) {
    local_58.context_ = this->context_;
    local_58.block_pressure_._M_h._M_buckets = &local_58.block_pressure_._M_h._M_single_bucket;
    local_58.block_pressure_._M_h._M_bucket_count = 1;
    local_58.block_pressure_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_58.block_pressure_._M_h._M_element_count = 0;
    local_58.block_pressure_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_58.block_pressure_._M_h._M_rehash_policy._M_next_resize = 0;
    local_58.block_pressure_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_60 = f;
    RegisterLiveness::Analyze(&local_58,f);
    ppVar3 = std::
             _Hashtable<spvtools::opt::Function_const*,std::pair<spvtools::opt::Function_const*const,spvtools::opt::RegisterLiveness>,std::allocator<std::pair<spvtools::opt::Function_const*const,spvtools::opt::RegisterLiveness>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Function_const*>,std::hash<spvtools::opt::Function_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_emplace<spvtools::opt::Function*&,spvtools::opt::RegisterLiveness>
                       (&this->analysis_cache_,&local_60,&local_58);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_58.block_pressure_._M_h);
  }
  return (RegisterLiveness *)(ppVar3 + 1);
}

Assistant:

const RegisterLiveness* Get(Function* f) {
    LivenessAnalysisMap::iterator it = analysis_cache_.find(f);
    if (it != analysis_cache_.end()) {
      return &it->second;
    }
    return &analysis_cache_.emplace(f, RegisterLiveness{context_, f})
                .first->second;
  }